

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

VariablePattern * __thiscall
slang::BumpAllocator::
emplace<slang::ast::VariablePattern,slang::ast::PatternVarSymbol_const&,slang::SourceRange>
          (BumpAllocator *this,PatternVarSymbol *args,SourceRange *args_1)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  VariablePattern *pVVar3;
  
  pVVar3 = (VariablePattern *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((VariablePattern *)this->endPtr < pVVar3 + 1) {
    pVVar3 = (VariablePattern *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pVVar3 + 1);
  }
  SVar1 = args_1->startLoc;
  SVar2 = args_1->endLoc;
  (pVVar3->super_Pattern).kind = Variable;
  (pVVar3->super_Pattern).syntax = (SyntaxNode *)0x0;
  (pVVar3->super_Pattern).sourceRange.startLoc = SVar1;
  (pVVar3->super_Pattern).sourceRange.endLoc = SVar2;
  pVVar3->variable = args;
  return pVVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }